

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

void ReverbConvertI3DL2ToNative9
               (FAudioFXReverbI3DL2Parameters *pI3DL2,FAudioFXReverbParameters9 *pNative,
               int32_t sevenDotOneReverb)

{
  int in_EDX;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  double dVar1;
  int32_t index_1;
  int32_t index;
  float reverbDelay;
  float reflectionsDelay;
  char local_2c;
  char local_28;
  int local_24;
  int local_20;
  float local_1c;
  float local_18;
  
  if (in_EDX == 0) {
    *(undefined1 *)((long)in_RSI + 9) = 5;
  }
  else {
    *(undefined1 *)((long)in_RSI + 9) = 0x14;
  }
  *(undefined1 *)((long)in_RSI + 10) = 5;
  *(undefined1 *)((long)in_RSI + 0xb) = 6;
  *(undefined1 *)(in_RSI + 3) = 6;
  *(undefined1 *)((long)in_RSI + 0xd) = 0x1b;
  *(undefined1 *)((long)in_RSI + 0xe) = 0x1b;
  *(undefined4 *)((long)in_RSI + 0x31) = 0x42c80000;
  *(undefined1 *)((long)in_RSI + 0x12) = 4;
  *(undefined1 *)(in_RSI + 5) = 6;
  *(float *)((long)in_RSI + 0x19) = (float)(int)in_RDI[1] / 100.0;
  *(float *)((long)in_RSI + 0x1d) = (float)(int)in_RDI[2] / 100.0;
  if ((float)in_RDI[5] < 1.0) {
    dVar1 = (double)SDL_log10((double)(float)in_RDI[5]);
    local_24 = (int)(dVar1 * 4.0);
    if (local_24 < -8) {
      local_24 = -8;
    }
    *(undefined1 *)((long)in_RSI + 0x11) = 8;
    if (local_24 < 0) {
      local_2c = (char)local_24 + '\b';
    }
    else {
      local_2c = '\b';
    }
    *(char *)((long)in_RSI + 0x13) = local_2c;
    *(undefined4 *)((long)in_RSI + 0x29) = in_RDI[4];
  }
  else {
    dVar1 = (double)SDL_log10((double)(float)in_RDI[5]);
    local_20 = (int)(dVar1 * -4.0);
    if (local_20 < -8) {
      local_20 = -8;
    }
    if (local_20 < 0) {
      local_28 = (char)local_20 + '\b';
    }
    else {
      local_28 = '\b';
    }
    *(char *)((long)in_RSI + 0x11) = local_28;
    *(undefined1 *)((long)in_RSI + 0x13) = 8;
    *(float *)((long)in_RSI + 0x29) = (float)in_RDI[4] * (float)in_RDI[5];
  }
  local_18 = (float)in_RDI[7] * 1000.0;
  if (local_18 < 300.0) {
    if (local_18 <= 1.0) {
      local_18 = 1.0;
    }
  }
  else {
    local_18 = 299.0;
  }
  in_RSI[1] = (int)(long)local_18;
  local_1c = (float)in_RDI[9] * 1000.0;
  if (85.0 <= local_1c) {
    local_1c = 84.0;
  }
  *(char *)(in_RSI + 2) = (char)(int)local_1c;
  *(float *)((long)in_RSI + 0x21) = (float)(int)in_RDI[6] / 100.0;
  *(float *)((long)in_RSI + 0x25) = (float)(int)in_RDI[8] / 100.0;
  *(char *)((long)in_RSI + 0xf) = (char)(int)(((float)in_RDI[10] * 15.0) / 100.0);
  *(undefined1 *)(in_RSI + 4) = *(undefined1 *)((long)in_RSI + 0xf);
  *(undefined4 *)((long)in_RSI + 0x2d) = in_RDI[0xb];
  *(undefined4 *)((long)in_RSI + 0x15) = in_RDI[0xc];
  *in_RSI = *in_RDI;
  return;
}

Assistant:

void ReverbConvertI3DL2ToNative9(
	const FAudioFXReverbI3DL2Parameters *pI3DL2,
	FAudioFXReverbParameters9 *pNative,
	int32_t sevenDotOneReverb
) {
	float reflectionsDelay;
	float reverbDelay;

	if (sevenDotOneReverb)
	{
		pNative->RearDelay = FAUDIOFX_REVERB_DEFAULT_7POINT1_REAR_DELAY;
	}
	else
	{
		pNative->RearDelay = FAUDIOFX_REVERB_DEFAULT_REAR_DELAY;
	}
	pNative->SideDelay = FAUDIOFX_REVERB_DEFAULT_7POINT1_SIDE_DELAY;
	pNative->PositionLeft = FAUDIOFX_REVERB_DEFAULT_POSITION;
	pNative->PositionRight = FAUDIOFX_REVERB_DEFAULT_POSITION;
	pNative->PositionMatrixLeft = FAUDIOFX_REVERB_DEFAULT_POSITION_MATRIX;
	pNative->PositionMatrixRight = FAUDIOFX_REVERB_DEFAULT_POSITION_MATRIX;
	pNative->RoomSize = FAUDIOFX_REVERB_DEFAULT_ROOM_SIZE;
	pNative->LowEQCutoff = 4;
	pNative->HighEQCutoff = 6;

	pNative->RoomFilterMain = (float) pI3DL2->Room / 100.0f;
	pNative->RoomFilterHF = (float) pI3DL2->RoomHF / 100.0f;

	if (pI3DL2->DecayHFRatio >= 1.0f)
	{
		int32_t index = (int32_t) (-4.0 * FAudio_log10(pI3DL2->DecayHFRatio));
		if (index < -8)
		{
			index = -8;
		}
		pNative->LowEQGain = (uint8_t) ((index < 0) ? index + 8 : 8);
		pNative->HighEQGain = 8;
		pNative->DecayTime = pI3DL2->DecayTime * pI3DL2->DecayHFRatio;
	}
	else
	{
		int32_t index = (int32_t) (4.0 * FAudio_log10(pI3DL2->DecayHFRatio));
		if (index < -8)
		{
			index = -8;
		}
		pNative->LowEQGain = 8;
		pNative->HighEQGain = (uint8_t) ((index < 0) ? index + 8 : 8);
		pNative->DecayTime = pI3DL2->DecayTime;
	}

	reflectionsDelay = pI3DL2->ReflectionsDelay * 1000.0f;
	if (reflectionsDelay >= FAUDIOFX_REVERB_MAX_REFLECTIONS_DELAY)
	{
		reflectionsDelay = (float) (FAUDIOFX_REVERB_MAX_REFLECTIONS_DELAY - 1);
	}
	else if (reflectionsDelay <= 1)
	{
		reflectionsDelay = 1;
	}
	pNative->ReflectionsDelay = (uint32_t) reflectionsDelay;

	reverbDelay = pI3DL2->ReverbDelay * 1000.0f;
	if (reverbDelay >= FAUDIOFX_REVERB_MAX_REVERB_DELAY)
	{
		reverbDelay = (float) (FAUDIOFX_REVERB_MAX_REVERB_DELAY - 1);
	}
	pNative->ReverbDelay = (uint8_t) reverbDelay;

	pNative->ReflectionsGain = pI3DL2->Reflections / 100.0f;
	pNative->ReverbGain = pI3DL2->Reverb / 100.0f;
	pNative->EarlyDiffusion = (uint8_t) (15.0f * pI3DL2->Diffusion / 100.0f);
	pNative->LateDiffusion = pNative->EarlyDiffusion;
	pNative->Density = pI3DL2->Density;
	pNative->RoomFilterFreq = pI3DL2->HFReference;

	pNative->WetDryMix = pI3DL2->WetDryMix;
}